

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.hpp
# Opt level: O2

void __thiscall front::symbol::FunctionSymbol::~FunctionSymbol(FunctionSymbol *this)

{
  std::
  vector<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>
  ::~vector(&this->_params);
  Symbol::~Symbol(&this->super_Symbol);
  return;
}

Assistant:

virtual ~FunctionSymbol() {}